

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.h
# Opt level: O3

void __thiscall
cbtQuantizedBvh::mergeInternalNodeAabb
          (cbtQuantizedBvh *this,int nodeIndex,cbtVector3 *newAabbMin,cbtVector3 *newAabbMax)

{
  cbtOptimizedBvhNode *pcVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  cbtQuantizedBvhNode cVar6;
  cbtQuantizedBvhNode *pcVar7;
  cbtOptimizedBvhNode *pcVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [32];
  ushort uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 unaff_retaddr;
  undefined2 uStack_a;
  undefined2 uStack_2;
  
  if (this->m_useQuantization == true) {
    fVar2 = (this->m_bvhAabbMin).m_floats[2];
    fVar3 = (this->m_bvhQuantization).m_floats[2];
    auVar22._8_8_ = 0;
    auVar22._0_8_ = *(ulong *)(this->m_bvhAabbMin).m_floats;
    uVar5 = *(undefined8 *)(this->m_bvhQuantization).m_floats;
    auVar23._8_2_ = 0xfffe;
    auVar23._0_8_ = 0xfffefffefffefffe;
    auVar23._10_2_ = 0xfffe;
    auVar23._12_2_ = 0xfffe;
    auVar23._14_2_ = 0xfffe;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *(ulong *)newAabbMin->m_floats;
    uVar12 = (ushort)(int)((newAabbMin->m_floats[2] - fVar2) * fVar3);
    auVar16 = vsubps_avx(auVar15,auVar22);
    fVar9 = (float)uVar5;
    fVar10 = (float)((ulong)uVar5 >> 0x20);
    auVar17._0_4_ = (int)(auVar16._0_4_ * fVar9);
    auVar17._4_4_ = (int)(auVar16._4_4_ * fVar10);
    auVar17._8_4_ = (int)(auVar16._8_4_ * 0.0);
    auVar17._12_4_ = (int)(auVar16._12_4_ * 0.0);
    auVar16 = vpshuflw_avx(auVar17,0xe8);
    auVar16 = vpand_avx(auVar16,auVar23);
    fVar4 = newAabbMax->m_floats[2];
    auVar21._8_2_ = 1;
    auVar21._0_8_ = 0x1000100010001;
    auVar21._10_2_ = 1;
    auVar21._12_2_ = 1;
    auVar21._14_2_ = 1;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = *(ulong *)newAabbMax->m_floats;
    auVar13 = vsubps_avx(auVar18,auVar22);
    auVar19._0_4_ = fVar9 * auVar13._0_4_;
    auVar19._4_4_ = fVar10 * auVar13._4_4_;
    auVar19._8_4_ = auVar13._8_4_ * 0.0;
    auVar19._12_4_ = auVar13._12_4_ * 0.0;
    auVar13._8_4_ = 0x3f800000;
    auVar13._0_8_ = 0x3f8000003f800000;
    auVar13._12_4_ = 0x3f800000;
    auVar13 = vaddps_avx512vl(auVar19,auVar13);
    auVar20._0_4_ = (int)auVar13._0_4_;
    auVar20._4_4_ = (int)auVar13._4_4_;
    auVar20._8_4_ = (int)auVar13._8_4_;
    auVar20._12_4_ = (int)auVar13._12_4_;
    auVar13 = vpshuflw_avx(auVar20,0xe8);
    auVar13 = vpor_avx(auVar13,auVar21);
    auVar14._8_8_ = unaff_retaddr;
    auVar14._0_8_ = CONCAT26(uStack_2,CONCAT24(uVar12,auVar16._0_4_)) & 0xfffffffeffffffff;
    auVar14 = vmovdqu16_avx512vl(auVar14);
    pcVar7 = (this->m_quantizedContiguousNodes).m_data;
    auVar15 = vmovdqu16_avx512vl((undefined1  [16])pcVar7[nodeIndex]);
    uVar5 = vpcmpuw_avx512vl(ZEXT616(auVar15._0_6_),ZEXT616(auVar14._0_6_),6);
    auVar11 = vpmovm2d_avx512vl(uVar5);
    auVar11 = vblendps_avx(ZEXT832(0),auVar11,7);
    vpmovd2m_avx512vl(auVar11);
    cVar6 = (cbtQuantizedBvhNode)vmovdqu16_avx512vl(ZEXT616(auVar14._0_6_));
    pcVar7[nodeIndex] = cVar6;
    auVar14 = vmovdqu16_avx512vl(*(undefined1 (*) [16])pcVar7[nodeIndex].m_quantizedAabbMax);
    auVar16._8_4_ = auVar16._0_4_;
    auVar16._0_8_ =
         CONCAT26(uStack_a,CONCAT24((short)(int)(fVar3 * (fVar4 - fVar2) + 1.0),auVar13._0_4_)) |
         0x100000000;
    auVar16._12_2_ = uVar12 & 0xfffe;
    auVar16._14_2_ = uStack_2;
    auVar16 = vmovdqu16_avx512vl(auVar16);
    uVar5 = vpcmpuw_avx512vl(ZEXT616(auVar14._0_6_),ZEXT616(auVar16._0_6_),1);
    auVar11 = vpmovm2d_avx512vl(uVar5);
    auVar11 = vblendps_avx(ZEXT832(0),auVar11,7);
    vpmovd2m_avx512vl(auVar11);
    auVar16 = vmovdqu16_avx512vl(ZEXT616(auVar16._0_6_));
    *(undefined1 (*) [16])pcVar7[nodeIndex].m_quantizedAabbMax = auVar16;
    return;
  }
  pcVar8 = (this->m_contiguousNodes).m_data;
  pcVar1 = pcVar8 + nodeIndex;
  if (newAabbMin->m_floats[0] < pcVar8[nodeIndex].m_aabbMinOrg.m_floats[0]) {
    (pcVar1->m_aabbMinOrg).m_floats[0] = newAabbMin->m_floats[0];
  }
  if (newAabbMin->m_floats[1] < (pcVar1->m_aabbMinOrg).m_floats[1]) {
    (pcVar1->m_aabbMinOrg).m_floats[1] = newAabbMin->m_floats[1];
  }
  if (newAabbMin->m_floats[2] < (pcVar1->m_aabbMinOrg).m_floats[2]) {
    (pcVar1->m_aabbMinOrg).m_floats[2] = newAabbMin->m_floats[2];
  }
  if (newAabbMin->m_floats[3] < (pcVar1->m_aabbMinOrg).m_floats[3]) {
    (pcVar1->m_aabbMinOrg).m_floats[3] = newAabbMin->m_floats[3];
  }
  if ((pcVar1->m_aabbMaxOrg).m_floats[0] < newAabbMax->m_floats[0]) {
    (pcVar1->m_aabbMaxOrg).m_floats[0] = newAabbMax->m_floats[0];
  }
  if ((pcVar1->m_aabbMaxOrg).m_floats[1] < newAabbMax->m_floats[1]) {
    (pcVar1->m_aabbMaxOrg).m_floats[1] = newAabbMax->m_floats[1];
  }
  if ((pcVar1->m_aabbMaxOrg).m_floats[2] < newAabbMax->m_floats[2]) {
    (pcVar1->m_aabbMaxOrg).m_floats[2] = newAabbMax->m_floats[2];
  }
  if ((pcVar1->m_aabbMaxOrg).m_floats[3] < newAabbMax->m_floats[3]) {
    (pcVar1->m_aabbMaxOrg).m_floats[3] = newAabbMax->m_floats[3];
  }
  return;
}

Assistant:

void mergeInternalNodeAabb(int nodeIndex, const cbtVector3& newAabbMin, const cbtVector3& newAabbMax)
	{
		if (m_useQuantization)
		{
			unsigned short int quantizedAabbMin[3];
			unsigned short int quantizedAabbMax[3];
			quantize(quantizedAabbMin, newAabbMin, 0);
			quantize(quantizedAabbMax, newAabbMax, 1);
			for (int i = 0; i < 3; i++)
			{
				if (m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[i] > quantizedAabbMin[i])
					m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[i] = quantizedAabbMin[i];

				if (m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[i] < quantizedAabbMax[i])
					m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[i] = quantizedAabbMax[i];
			}
		}
		else
		{
			//non-quantized
			m_contiguousNodes[nodeIndex].m_aabbMinOrg.setMin(newAabbMin);
			m_contiguousNodes[nodeIndex].m_aabbMaxOrg.setMax(newAabbMax);
		}
	}